

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1b6d1::
ARTOOMTest_Node16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTOOMTest_Node16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  pointer *this_00;
  bool bVar1;
  size_t *psVar2;
  key_type key;
  key_type k;
  value_view v;
  value_view v_00;
  undefined1 local_158 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_158,false);
  psVar2 = &DAT_001fd198;
  k = 0;
  do {
    v._M_extent._M_extent_value = *psVar2;
    v._M_ptr = (pointer)psVar2[-1];
    unodb::test::
    tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
    insert_internal((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_158,k,v,false);
    k = k + 1;
    psVar2 = psVar2 + 2;
  } while (k != 4);
  local_58._M_dataplus._M_p = (pointer)0x4;
  local_58._M_string_length = 1;
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_38 = 0;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  assert_node_counts((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_158,(node_type_counter_array *)&local_58);
  local_58._M_dataplus._M_p = (pointer)0x1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  assert_growing_inodes
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_158,(inode_type_counter_array *)&local_58);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_58._M_string_length = 0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    v_00._M_extent._M_extent_value = 1;
    v_00._M_ptr = &unodb::test::test_value_1;
    unodb::test::
    tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
    insert_internal((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_158,5,v_00,false);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_58,0,local_58._M_string_length,
             "Expected: test(verifier) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
             ,0x61);
  testing::Message::Message((Message *)local_78);
  this_00 = &verifier.key_views.
             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_oom.cpp"
             ,0x30,local_58._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)local_78);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  if (local_78[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78[0]._M_head_impl + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (verifier._184_8_ != 0) {
    operator_delete((void *)verifier._184_8_,
                    (long)verifier.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - verifier._184_8_);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               *)&verifier.test_db.key_prefix_splits);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~db
            ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node16) {
  oom_insert_test<TypeParam>(
      3,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(0, 4);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({4, 1, 0, 0, 0});
        verifier.assert_growing_inodes({1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      },
      5, unodb::test::test_values[0],
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({5, 0, 1, 0, 0});
        verifier.assert_growing_inodes({1, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      });
}